

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O0

void __thiscall PGSStreamReader::renderTextShow(PGSStreamReader *this,int64_t inTime)

{
  TextToPGSConverter *this_00;
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  long lVar4;
  uint8_t *buff;
  long dts;
  long local_a0;
  long local_98;
  int64_t odfPTS;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  int local_64;
  uint8_t *puStack_60;
  int rLen;
  uint8_t *curPos;
  int64_t PRESENTATION_DTS_DELTA;
  int64_t PLANEINITIALIZATIONTIME;
  int64_t windowsTransferTime;
  int64_t compositionDecodeTime;
  double decodedObjectSize;
  long lStack_28;
  int idx;
  uint8_t *tmp;
  int step;
  uint32_t mask;
  int64_t inTime_local;
  PGSStreamReader *this_local;
  
  _step = inTime;
  inTime_local = (int64_t)this;
  std::vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
  ::clear(&this->m_renderedBlocks);
  this->m_firstRenderedPacket = true;
  tmp._4_4_ = 0;
  tmp._0_4_ = 0;
  while (bVar1 = text_subtitles::TextToPGSConverter::rlePack(this->m_render,tmp._4_4_),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    lStack_28 = (long)&tmp + 4;
    decodedObjectSize._4_4_ = (int)tmp % 4;
    *(char *)(lStack_28 + decodedObjectSize._4_4_) =
         *(char *)(lStack_28 + decodedObjectSize._4_4_) << 1;
    *(char *)(lStack_28 + decodedObjectSize._4_4_) =
         *(char *)(lStack_28 + decodedObjectSize._4_4_) + '\x01';
    tmp._0_4_ = (int)tmp + 1;
  }
  _step = _step / 0xe5b0;
  uVar2 = text_subtitles::TextToPGSConverter::renderedHeight(this->m_render);
  compositionDecodeTime = (int64_t)(double)(int)((uint)uVar2 * (uint)this->m_scaled_width);
  windowsTransferTime = (int64_t)(((double)compositionDecodeTime * 90000.0) / 16000000.0 + 0.999);
  PLANEINITIALIZATIONTIME =
       (int64_t)(((double)compositionDecodeTime * 90000.0) / 32000000.0 + 0.999);
  PRESENTATION_DTS_DELTA =
       (int64_t)(((double)(int)((uint)this->m_scaled_width * (uint)this->m_scaled_height) * 90000.0)
                 / 32000000.0 + 0.999);
  curPos = (uint8_t *)(PRESENTATION_DTS_DELTA + PLANEINITIALIZATIONTIME);
  text_subtitles::TextToPGSConverter::renderedHeight(this->m_render);
  uVar2 = text_subtitles::TextToPGSConverter::renderedHeight(this->m_render);
  this->m_objectWindowHeight = uVar2;
  uVar2 = text_subtitles::TextToPGSConverter::maxLine(this->m_render);
  this->m_objectWindowTop = uVar2;
  puStack_60 = this->m_renderedData;
  lVar4 = text_subtitles::TextToPGSConverter::composePresentationSegment
                    (this->m_render,puStack_60,Start,_step,_step - (long)curPos,
                     this->m_objectWindowTop,
                     (bool)((this->super_AbstractStreamReader).m_demuxMode & 1),
                     (bool)(this->m_forced_on_flag & 1));
  local_64 = (int)lVar4;
  local_70 = _step - (long)curPos;
  std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>::
  emplace_back<long&,long,int&,unsigned_char*&>
            ((vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>
              *)&this->m_renderedBlocks,(long *)&step,&local_70,&local_64,&stack0xffffffffffffffa0);
  puStack_60 = puStack_60 + local_64;
  lVar4 = text_subtitles::TextToPGSConverter::composeWindowDefinition
                    (this->m_render,puStack_60,_step - PLANEINITIALIZATIONTIME,_step - (long)curPos,
                     this->m_objectWindowTop,this->m_objectWindowHeight,
                     (bool)((this->super_AbstractStreamReader).m_demuxMode & 1));
  local_64 = (int)lVar4;
  local_78 = _step - PLANEINITIALIZATIONTIME;
  local_80 = _step - (long)curPos;
  std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>::
  emplace_back<long,long,int&,unsigned_char*&>
            ((vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>
              *)&this->m_renderedBlocks,&local_78,&local_80,&local_64,&stack0xffffffffffffffa0);
  puStack_60 = puStack_60 + local_64;
  lVar4 = text_subtitles::TextToPGSConverter::composePaletteDefinition
                    (this->m_render,&this->m_render->m_paletteByColor,puStack_60,
                     _step - (long)curPos,_step - (long)curPos,
                     (bool)((this->super_AbstractStreamReader).m_demuxMode & 1));
  local_64 = (int)lVar4;
  local_88 = _step - (long)curPos;
  odfPTS = _step - (long)curPos;
  std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>::
  emplace_back<long,long,int&,unsigned_char*&>
            ((vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>
              *)&this->m_renderedBlocks,&local_88,&odfPTS,&local_64,&stack0xffffffffffffffa0);
  buff = puStack_60 + local_64;
  lVar4 = (_step - (long)curPos) + windowsTransferTime;
  this_00 = this->m_render;
  dts = _step - (long)curPos;
  local_98 = lVar4;
  puStack_60 = buff;
  uVar2 = text_subtitles::TextToPGSConverter::minLine(this->m_render);
  uVar3 = text_subtitles::TextToPGSConverter::maxLine(this->m_render);
  lVar4 = text_subtitles::TextToPGSConverter::composeObjectDefinition
                    (this_00,buff,lVar4,dts,(uint)uVar2,(uint)uVar3,
                     (bool)((this->super_AbstractStreamReader).m_demuxMode & 1));
  local_64 = (int)lVar4;
  local_a0 = _step - (long)curPos;
  std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>::
  emplace_back<long_const&,long,int&,unsigned_char*&>
            ((vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>
              *)&this->m_renderedBlocks,&local_98,&local_a0,&local_64,&stack0xffffffffffffffa0);
  puStack_60 = puStack_60 + local_64;
  lVar4 = text_subtitles::TextToPGSConverter::composeEnd
                    (this->m_render,puStack_60,local_98,local_98,
                     (bool)((this->super_AbstractStreamReader).m_demuxMode & 1));
  local_64 = (int)lVar4;
  std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>::
  emplace_back<long_const&,long_const&,int&,unsigned_char*&>
            ((vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>
              *)&this->m_renderedBlocks,&local_98,&local_98,&local_64,&stack0xffffffffffffffa0);
  return;
}

Assistant:

void PGSStreamReader::renderTextShow(int64_t inTime)
{
    m_renderedBlocks.clear();
    m_firstRenderedPacket = true;

    uint32_t mask = 0;
    int step = 0;
    while (!m_render->rlePack(mask))
    {
        // reduce colors
        const auto tmp = reinterpret_cast<uint8_t*>(&mask);
        const int idx = step++ % 4;
        tmp[idx] <<= 1;
        tmp[idx]++;
    }
    inTime = inTime / INT_FREQ_TO_TS_FREQ;

    const double decodedObjectSize = m_render->renderedHeight() * m_scaled_width;
    const auto compositionDecodeTime = static_cast<int64_t>(90000.0 * decodedObjectSize / PIXEL_DECODING_RATE + 0.999);
    const auto windowsTransferTime = static_cast<int64_t>(90000.0 * decodedObjectSize / PIXEL_COMPOSITION_RATE + 0.999);
    const auto PLANEINITIALIZATIONTIME =
        static_cast<int64_t>(90000.0 * (m_scaled_width * m_scaled_height) / PIXEL_COMPOSITION_RATE + 0.999);
    const int64_t PRESENTATION_DTS_DELTA = PLANEINITIALIZATIONTIME + windowsTransferTime;

    m_objectWindowHeight = FFMAX(0, m_render->renderedHeight());
    m_objectWindowTop = m_render->maxLine();

    // show text
    uint8_t* curPos = m_renderedData;
    // composition segment. pts=x,  dts = x-0.0648 (pts alignment to video grid) (I get constant value from real PGS
    // track as example)
    int rLen =
        m_render->composePresentationSegment(curPos, CompositionMode::Start, inTime, inTime - PRESENTATION_DTS_DELTA,
                                             m_objectWindowTop, m_demuxMode, m_forced_on_flag);
    m_renderedBlocks.emplace_back(inTime, inTime - PRESENTATION_DTS_DELTA, rLen, curPos);
    curPos += rLen;
    // window definition.   pts=x-0.001, dts = x-0.0648
    rLen = m_render->composeWindowDefinition(curPos, inTime - windowsTransferTime, inTime - PRESENTATION_DTS_DELTA,
                                             m_objectWindowTop, m_objectWindowHeight, m_demuxMode);
    m_renderedBlocks.emplace_back(inTime - windowsTransferTime, inTime - PRESENTATION_DTS_DELTA, rLen, curPos);
    curPos += rLen;

    // palette.             pts=x-0.0648, dts = x-0.0648
    rLen = m_render->composePaletteDefinition(m_render->m_paletteByColor, curPos, inTime - PRESENTATION_DTS_DELTA,
                                              inTime - PRESENTATION_DTS_DELTA, m_demuxMode);
    m_renderedBlocks.emplace_back(inTime - PRESENTATION_DTS_DELTA, inTime - PRESENTATION_DTS_DELTA, rLen, curPos);
    curPos += rLen;
    // object               pts=x-0.0627, dts = x-0.0648
    // inTime - 5643
    const int64_t odfPTS = inTime - PRESENTATION_DTS_DELTA + compositionDecodeTime;
    rLen = m_render->composeObjectDefinition(curPos, odfPTS, inTime - PRESENTATION_DTS_DELTA, m_render->minLine(),
                                             m_render->maxLine(), m_demuxMode);
    m_renderedBlocks.emplace_back(odfPTS, inTime - PRESENTATION_DTS_DELTA, rLen, curPos);
    curPos += rLen;
    // end                  pts=x-0.0627, dts = x-0.0627
    rLen = m_render->composeEnd(curPos, odfPTS, odfPTS, m_demuxMode);
    m_renderedBlocks.emplace_back(odfPTS, odfPTS, rLen, curPos);
}